

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyNonFloatItems_helper
          (QGraphicsAnchorLayoutPrivate *this,AnchorData *ad,
          QSet<QGraphicsLayoutItem_*> *nonFloatingItemsIdentifiedSoFar)

{
  qreal qVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QSet<QGraphicsLayoutItem_*> local_40 [2];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(ad->field_0x78 & 3) {
  case 1:
switchD_0055fe83_caseD_1:
    qVar1 = ad[1].super_QSimplexVariable.result;
    lVar2 = *(long *)&ad[1].super_QSimplexVariable.index;
    for (lVar3 = 0; lVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      identifyNonFloatItems_helper
                (this,*(AnchorData **)((long)qVar1 + lVar3),nonFloatingItemsIdentifiedSoFar);
    }
    break;
  case 2:
switchD_0055fe83_caseD_2:
    identifyNonFloatItems_helper
              (this,(AnchorData *)ad[1]._vptr_AnchorData,nonFloatingItemsIdentifiedSoFar);
    ad = (AnchorData *)ad[1].super_QSimplexVariable.result;
    switch(ad->field_0x78 & 3) {
    case 1:
      goto switchD_0055fe83_caseD_1;
    case 2:
      goto switchD_0055fe83_caseD_2;
    case 3:
      goto switchD_0055fe83_caseD_3;
    }
  case 0:
    if ((ad->item != (QGraphicsLayoutItem *)0x0) &&
       (ad->item != (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr)) {
      QSet<QGraphicsLayoutItem_*>::insert
                (local_40,(QGraphicsLayoutItem **)nonFloatingItemsIdentifiedSoFar);
    }
    break;
  case 3:
    break;
  }
switchD_0055fe83_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyNonFloatItems_helper(const AnchorData *ad, QSet<QGraphicsLayoutItem *> *nonFloatingItemsIdentifiedSoFar)
{
    Q_Q(QGraphicsAnchorLayout);

    switch(ad->type) {
    case AnchorData::Normal:
        if (ad->item && ad->item != q)
            nonFloatingItemsIdentifiedSoFar->insert(ad->item);
        break;
    case AnchorData::Sequential:
        for (const AnchorData *d : static_cast<const SequentialAnchorData *>(ad)->m_edges)
            identifyNonFloatItems_helper(d, nonFloatingItemsIdentifiedSoFar);
        break;
    case AnchorData::Parallel:
        identifyNonFloatItems_helper(static_cast<const ParallelAnchorData *>(ad)->firstEdge, nonFloatingItemsIdentifiedSoFar);
        identifyNonFloatItems_helper(static_cast<const ParallelAnchorData *>(ad)->secondEdge, nonFloatingItemsIdentifiedSoFar);
        break;
    }
}